

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearHash.h
# Opt level: O2

void __thiscall
LinearHash<int,_int>::LinearHash(LinearHash<int,_int> *this,ion_dictionary_config_info_t config)

{
  int __oflag;
  char *in_RSI;
  
  linear_hash_dict_init((ion_dictionary_handler_t *)this);
  Dictionary<int,_int>::open(&this->super_Dictionary<int,_int>,in_RSI,__oflag);
  return;
}

Assistant:

LinearHash(
	ion_dictionary_config_info_t config
) {
	linear_hash_dict_init(&this->handler);

	this->open(config);
}